

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O0

void __thiscall
asmjit::_abi_1_10::RACFGBuilderT<asmjit::_abi_1_10::x86::RACFGBuilder>::_logNode
          (RACFGBuilderT<asmjit::_abi_1_10::x86::RACFGBuilder> *this,BaseNode *node,
          uint32_t indentation,char *action)

{
  long in_RCX;
  RACFGBuilderT<asmjit::_abi_1_10::x86::RACFGBuilder> *in_RDI;
  double __x;
  BaseNode *in_stack_000002f0;
  BaseBuilder *in_stack_000002f8;
  FormatOptions *in_stack_00000300;
  String *in_stack_00000308;
  char *in_stack_ffffffffffffffc8;
  char c;
  String *in_stack_ffffffffffffffd0;
  FormatOptions *this_00;
  
  String::clear(in_stack_ffffffffffffffd0);
  String::appendChars(in_stack_ffffffffffffffd0,(char)((ulong)in_stack_ffffffffffffffc8 >> 0x38),
                      0x1a3133);
  if (in_RCX != 0) {
    String::append(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x1a3155);
    String::append(in_stack_ffffffffffffffd0,(char)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
  }
  c = (char)((ulong)&in_RDI->_sb >> 0x38);
  this_00 = &in_RDI->_formatOptions;
  cc(in_RDI);
  Formatter::formatNode(in_stack_00000308,in_stack_00000300,in_stack_000002f8,in_stack_000002f0);
  String::append((String *)this_00,c);
  Logger::log(in_RDI->_logger,__x);
  return;
}

Assistant:

void _logNode(BaseNode* node, uint32_t indentation, const char* action) noexcept {
    _sb.clear();
    _sb.appendChars(' ', indentation);
    if (action) {
      _sb.append(action);
      _sb.append(' ');
    }
    Formatter::formatNode(_sb, _formatOptions, cc(), node);
    _sb.append('\n');
    _logger->log(_sb);
  }